

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

void VP8LInitBitReader(VP8LBitReader *br,uint8_t *start,size_t length)

{
  size_t sVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  
  br->len_ = length;
  br->val_ = 0;
  br->bit_pos_ = 0;
  br->eos_ = 0;
  sVar1 = 8;
  if (length < 8) {
    sVar1 = length;
  }
  uVar4 = 0;
  pbVar3 = start;
  for (uVar2 = 0; (uint)((int)sVar1 * 8) != uVar2; uVar2 = uVar2 + 8) {
    uVar4 = uVar4 | (ulong)*pbVar3 << ((byte)uVar2 & 0x3f);
    pbVar3 = pbVar3 + 1;
  }
  br->val_ = uVar4;
  br->pos_ = sVar1;
  br->buf_ = start;
  return;
}

Assistant:

void VP8LInitBitReader(VP8LBitReader* const br, const uint8_t* const start,
                       size_t length) {
  size_t i;
  vp8l_val_t value = 0;
  assert(br != NULL);
  assert(start != NULL);
  assert(length < 0xfffffff8u);   // can't happen with a RIFF chunk.

  br->len_ = length;
  br->val_ = 0;
  br->bit_pos_ = 0;
  br->eos_ = 0;

  if (length > sizeof(br->val_)) {
    length = sizeof(br->val_);
  }
  for (i = 0; i < length; ++i) {
    value |= (vp8l_val_t)start[i] << (8 * i);
  }
  br->val_ = value;
  br->pos_ = length;
  br->buf_ = start;
}